

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::addImageProcessingQCOMDecoration
          (TGlslangToSpvTraverser *this,Id id,Decoration decor)

{
  Id id_00;
  pointer ppIVar1;
  iterator __position;
  bool bVar2;
  Instruction *pIVar3;
  vector<spv::Decoration,std::allocator<spv::Decoration>> *this_00;
  Op OVar4;
  Id texid;
  Id local_20;
  Decoration local_1c;
  
  ppIVar1 = (this->builder).module.idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar3 = ppIVar1[id];
  OVar4 = pIVar3->opCode;
  local_1c = decor;
  if (OVar4 == OpSampledImage) {
    if ((**(byte **)&(pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data & 1) == 0) goto LAB_0044d9c2;
    pIVar3 = ppIVar1[*(pIVar3->operands).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start];
    OVar4 = pIVar3->opCode;
  }
  if (OVar4 == OpLoad) {
    if ((**(byte **)&(pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data & 1) == 0) {
LAB_0044d9c2:
      __assert_fail("idOperand[op]",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                    ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
    }
    id_00 = *(pIVar3->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_20 = id_00;
    bVar2 = hasQCOMImageProceessingDecoration(this,id_00,decor);
    if (!bVar2) {
      spv::Builder::addDecoration(&this->builder,id_00,decor,-1);
      this_00 = (vector<spv::Decoration,std::allocator<spv::Decoration>> *)
                std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->idToQCOMDecorations,&local_20);
      __position._M_current = *(Decoration **)(this_00 + 8);
      if (__position._M_current == *(Decoration **)(this_00 + 0x10)) {
        std::vector<spv::Decoration,std::allocator<spv::Decoration>>::
        _M_realloc_insert<spv::Decoration_const&>(this_00,__position,&local_1c);
      }
      else {
        *__position._M_current = decor;
        *(Decoration **)(this_00 + 8) = __position._M_current + 1;
      }
    }
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::addImageProcessingQCOMDecoration(spv::Id id, spv::Decoration decor)
{
  spv::Op opc = builder.getOpCode(id);
  if (opc == spv::OpSampledImage) {
    id  = builder.getIdOperand(id, 0);
    opc = builder.getOpCode(id);
  }

  if (opc == spv::OpLoad) {
    spv::Id texid = builder.getIdOperand(id, 0);
    if (!hasQCOMImageProceessingDecoration(texid, decor)) {//
      builder.addDecoration(texid, decor);
      idToQCOMDecorations[texid].push_back(decor);
    }
  }
}